

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOutReference_GetSerializeVsize_Test::TestBody
          (ConfidentialTxOutReference_GetSerializeVsize_Test *this)

{
  bool *pbVar1;
  bool bVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar;
  ConfidentialAssetId asset;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  Message local_248;
  AssertHelper local_240;
  undefined1 local_238 [16];
  ConfidentialAssetId local_228;
  ConfidentialTxOutReference local_200;
  ConfidentialTxOut local_108;
  
  pbVar1 = &local_108.super_AbstractTxOut.value_.ignore_check_;
  local_108.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"1234567890123456789012345678901234567890123456789012345678901234"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_228,(string *)&local_108);
  if (local_108.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar1) {
    operator_delete(local_108.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  local_238._0_8_ = AVar4.amount_;
  local_238[8] = AVar4.ignore_check_;
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&local_200,(Amount *)local_238);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&local_108,&exp_script,&local_228,(ConfidentialValue *)&local_200);
  local_200.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if ((void *)local_200.super_AbstractTxOutReference.value_.amount_ != (void *)0x0) {
    operator_delete((void *)local_200.super_AbstractTxOutReference.value_.amount_);
  }
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&local_200,&local_108);
  local_248.ss_.ptr_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&local_200,false,0,0x34,(uint32_t *)0x0,0);
  local_240.data_._0_4_ = 0x43;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_238,"txout_ref.GetSerializeVsize(false)","67",(uint *)&local_248,
             (int *)&local_240);
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message(&local_248);
    if ((undefined8 *)CONCAT71(local_238._9_7_,local_238[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_238._9_7_,local_238[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x15e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_240,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_238 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_248.ss_.ptr_._0_4_ = 0x376;
  local_240.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&local_200,true,0,0x24,(uint32_t *)0x0,0);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_238,"886","txout_ref.GetSerializeVsize(true, 0, 36)",
             (int *)&local_248,(uint *)&local_240);
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message(&local_248);
    if ((undefined8 *)CONCAT71(local_238._9_7_,local_238[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_238._9_7_,local_238[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x160,pcVar3);
    testing::internal::AssertHelper::operator=(&local_240,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_238 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_248.ss_.ptr_._0_4_ = 0x4b6;
  local_240.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&local_200,true,0,0x34,(uint32_t *)0x0,0);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_238,"1206","txout_ref.GetSerializeVsize(true, 0, 52)",
             (int *)&local_248,(uint *)&local_240);
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message(&local_248);
    if ((undefined8 *)CONCAT71(local_238._9_7_,local_238[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_238._9_7_,local_238[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x162,pcVar3);
    testing::internal::AssertHelper::operator=(&local_240,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_238 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_248.ss_.ptr_._0_4_ = 0x4a7;
  local_240.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&local_200,true,0,0x34,(uint32_t *)0x0,2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_238,"1191","txout_ref.GetSerializeVsize(true, 0, 52, nullptr, 2)",
             (int *)&local_248,(uint *)&local_240);
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message(&local_248);
    if ((undefined8 *)CONCAT71(local_238._9_7_,local_238[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_238._9_7_,local_238[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x164,pcVar3);
    testing::internal::AssertHelper::operator=(&local_240,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_248.ss_.ptr_._4_4_,(uint32_t)local_248.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_238 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_200);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_108);
  local_228._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  if (local_228.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialTxOut, Setter) {
  ConfidentialTxOut txout;

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  txout.SetValue(Amount::CreateBySatoshiAmount(100000000));

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
      "010000000005f5e100");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  txout.SetCommitment(exp_asset, exp_value, exp_nonce, exp_surjection_proof,
                      exp_range_proof);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 100000000);
}